

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_ssg.h
# Opt level: O1

void __thiscall ymfm::ssg_engine::output(ssg_engine *this,output_data *output)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  
  bVar4 = (this->m_regs).m_regdata[0xd];
  bVar2 = bVar4 >> 3 & 1;
  if ((bVar2 == 1 && (bVar4 & 1) == 0) || (this->m_envelope_state < 0x20)) {
    uVar5 = this->m_envelope_state >> 5 & 1;
    if ((bVar4 & 2) == 0) {
      uVar5 = 0;
    }
    uVar1 = 0x1f;
    if (uVar5 != ((bVar4 >> 2 & 1) != 0)) {
      uVar1 = 0;
    }
    uVar1 = uVar1 ^ this->m_envelope_state & 0x1f;
  }
  else {
    this->m_envelope_state = 0x20;
    uVar1 = 0x1f;
    if (((bVar4 >> 1 ^ bVar4 >> 2) & bVar2) == 0) {
      uVar1 = 0;
    }
  }
  lVar3 = 0x38;
  do {
    bVar4 = (this->m_regs).m_regdata[7];
    uVar6 = 0;
    if ((((uint)((bVar4 >> ((int)lVar3 - 0x35U & 0x1f) & 1) != 0) | this->m_noise_state) &
        ((uint)((bVar4 >> ((int)lVar3 - 0x38U & 0x1f) & 1) != 0) |
        *(uint *)((long)this + lVar3 * 4 + -0xcc))) != 0) {
      bVar4 = *(byte *)((long)this->m_tone_count + lVar3 + -8);
      uVar6 = (ulong)uVar1;
      if ((bVar4 & 0x10) == 0) {
        bVar4 = bVar4 * '\x02' & 0x1e;
        uVar5 = (uint)(byte)(bVar4 + 1);
        if (bVar4 == 0) {
          uVar5 = 0;
        }
        uVar6 = (ulong)uVar5;
      }
    }
    *(int *)((long)output + lVar3 * 4 + -0xe0) = (int)ssg_engine::output::s_amplitudes[uVar6];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x3b);
  return;
}

Assistant:

uint32_t envelope_hold() const                      { return bitfield(m_regdata[0x0d], 0); }